

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O2

void free_pool(j_common_ptr cinfo,int pool_id)

{
  jpeg_memory_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var3;
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var4;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *p_Var5;
  _func_void_ptr_j_common_ptr_int_size_t *p_Var6;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *object;
  _func_void_ptr_j_common_ptr_int_size_t *object_00;
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **pp_Var7;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **pp_Var8;
  size_t sVar9;
  
  pjVar1 = cinfo->mem;
  if ((uint)pool_id < 2) {
    if (pool_id == 1) {
      pp_Var8 = &pjVar1[1].request_virt_sarray;
      while (p_Var3 = *pp_Var8,
            p_Var3 != (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                       *)0x0) {
        if (*(int *)(p_Var3 + 0x2c) != 0) {
          *(undefined4 *)(p_Var3 + 0x2c) = 0;
          (**(code **)(p_Var3 + 0x48))(cinfo,p_Var3 + 0x38);
        }
        pp_Var8 = (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   **)(p_Var3 + 0x30);
      }
      pjVar1[1].request_virt_sarray =
           (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
      pp_Var7 = &pjVar1[1].request_virt_barray;
      while (p_Var4 = *pp_Var7,
            p_Var4 != (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                       *)0x0) {
        if (*(int *)(p_Var4 + 0x2c) != 0) {
          *(undefined4 *)(p_Var4 + 0x2c) = 0;
          (**(code **)(p_Var4 + 0x48))(cinfo,p_Var4 + 0x38);
        }
        pp_Var7 = (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   **)(p_Var4 + 0x30);
      }
      pjVar1[1].request_virt_barray =
           (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
    }
  }
  else {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0xe;
    (pjVar2->msg_parm).i[0] = pool_id;
    (*cinfo->err->error_exit)(cinfo);
  }
  object = (&pjVar1[1].alloc_sarray)[pool_id];
  (&pjVar1[1].alloc_sarray)[pool_id] =
       (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)0x0;
  while (object != (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)0x0) {
    p_Var5 = *(_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION **)object;
    sVar9 = *(long *)(object + 8) + *(long *)(object + 0x10) + 0x37;
    jpeg_free_large(cinfo,object,sVar9);
    pjVar1[1].realize_virt_arrays = pjVar1[1].realize_virt_arrays + -sVar9;
    object = p_Var5;
  }
  object_00 = (&pjVar1[1].alloc_small)[pool_id];
  (&pjVar1[1].alloc_small)[pool_id] = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
  while (object_00 != (_func_void_ptr_j_common_ptr_int_size_t *)0x0) {
    p_Var6 = *(_func_void_ptr_j_common_ptr_int_size_t **)object_00;
    sVar9 = *(long *)(object_00 + 8) + *(long *)(object_00 + 0x10) + 0x37;
    jpeg_free_small(cinfo,object_00,sVar9);
    pjVar1[1].realize_virt_arrays = pjVar1[1].realize_virt_arrays + -sVar9;
    object_00 = p_Var6;
  }
  return;
}

Assistant:

METHODDEF(void)
free_pool(j_common_ptr cinfo, int pool_id)
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  small_pool_ptr shdr_ptr;
  large_pool_ptr lhdr_ptr;
  size_t space_freed;

  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id); /* safety check */

#ifdef MEM_STATS
  if (cinfo->err->trace_level > 1)
    print_mem_stats(cinfo, pool_id); /* print pool's memory usage statistics */
#endif

  /* If freeing IMAGE pool, close any virtual arrays first */
  if (pool_id == JPOOL_IMAGE) {
    jvirt_sarray_ptr sptr;
    jvirt_barray_ptr bptr;

    for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
      if (sptr->b_s_open) {     /* there may be no backing store */
        sptr->b_s_open = FALSE; /* prevent recursive close if error */
        (*sptr->b_s_info.close_backing_store) (cinfo, &sptr->b_s_info);
      }
    }
    mem->virt_sarray_list = NULL;
    for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
      if (bptr->b_s_open) {     /* there may be no backing store */
        bptr->b_s_open = FALSE; /* prevent recursive close if error */
        (*bptr->b_s_info.close_backing_store) (cinfo, &bptr->b_s_info);
      }
    }
    mem->virt_barray_list = NULL;
  }

  /* Release large objects */
  lhdr_ptr = mem->large_list[pool_id];
  mem->large_list[pool_id] = NULL;

  while (lhdr_ptr != NULL) {
    large_pool_ptr next_lhdr_ptr = lhdr_ptr->next;
    space_freed = lhdr_ptr->bytes_used +
                  lhdr_ptr->bytes_left +
                  sizeof(large_pool_hdr) + ALIGN_SIZE - 1;
    jpeg_free_large(cinfo, (void *)lhdr_ptr, space_freed);
    mem->total_space_allocated -= space_freed;
    lhdr_ptr = next_lhdr_ptr;
  }

  /* Release small objects */
  shdr_ptr = mem->small_list[pool_id];
  mem->small_list[pool_id] = NULL;

  while (shdr_ptr != NULL) {
    small_pool_ptr next_shdr_ptr = shdr_ptr->next;
    space_freed = shdr_ptr->bytes_used + shdr_ptr->bytes_left +
                  sizeof(small_pool_hdr) + ALIGN_SIZE - 1;
    jpeg_free_small(cinfo, (void *)shdr_ptr, space_freed);
    mem->total_space_allocated -= space_freed;
    shdr_ptr = next_shdr_ptr;
  }
}